

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O3

void helicsFederateProcessCommunications(HelicsFederate fed,HelicsTime period,HelicsError *err)

{
  Federate *this;
  FedObject *pFVar1;
  milliseconds period_00;
  
  pFVar1 = helics::getFedObject(fed,err);
  if ((pFVar1 != (FedObject *)0x0) &&
     (this = (pFVar1->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr, this != (Federate *)0x0)) {
    if (period <= -9223372036.854765) {
      period_00.__r = -0x8637bd05af6;
    }
    else if (9223372036.854765 <= period) {
      period_00.__r = 0x8637bd05af6;
    }
    else {
      period_00.__r =
           (long)(period * 1000000000.0 +
                 *(double *)(&DAT_004296c0 + (ulong)(0.0 <= period * 1000000000.0) * 8)) / 1000000;
    }
    helics::Federate::processCommunication(this,period_00);
  }
  return;
}

Assistant:

void helicsFederateProcessCommunications(HelicsFederate fed, HelicsTime period, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return;
    }
    try {
        fedObj->processCommunication(helics::Time(period).to_ms());
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}